

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O2

void __thiscall QOpenGL2PaintEngineExPrivate::resetClipIfNeeded(QOpenGL2PaintEngineExPrivate *this)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  QOpenGLRect local_88 [5];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->maxClip == 0x7f) {
    lVar1 = *(long *)&this->field_0x10;
    useSimpleShader(this);
    (**(code **)(*(long *)&this->funcs + 0x88))(0xb90);
    (**(code **)(*(long *)&this->funcs + 0x30))(0,0,0,0);
    local_98 = 0xffffffff;
    uStack_94 = 0xffffffff;
    uStack_90 = 0xffffffff;
    uStack_8c = 0xffffffff;
    local_a8 = 0xffffffff;
    uStack_a4 = 0xffffffff;
    uStack_a0 = 0xffffffff;
    uStack_9c = 0xffffffff;
    QTransform::inverted((bool *)local_88);
    QTransform::mapRect((QRectF *)&local_a8);
    local_88[0].left = (float)(double)CONCAT44(uStack_a4,local_a8);
    local_88[0].top = (float)(double)CONCAT44(uStack_9c,uStack_a0);
    local_88[0].right =
         (float)((double)CONCAT44(uStack_94,local_98) + (double)CONCAT44(uStack_a4,local_a8));
    local_88[0].bottom =
         (float)((double)CONCAT44(uStack_8c,uStack_90) + (double)CONCAT44(uStack_9c,uStack_a0));
    lVar2 = *(long *)(lVar1 + 8) + -8;
    if (*(long *)(lVar1 + 8) == 0) {
      lVar2 = 0;
    }
    (**(code **)(*(long *)&this->funcs + 0x128))(0x203,*(uint *)(lVar2 + 0x1c0) >> 9 & 0xff,0xff);
    (**(code **)(*(long *)&this->funcs + 0x138))(0x1e00,0x150a,0x150a);
    (**(code **)(*(long *)&this->funcs + 0x130))(0x80);
    composite(this,local_88);
    (**(code **)(*(long *)&this->funcs + 0x128))(0x205,1,0x80);
    (**(code **)(*(long *)&this->funcs + 0x138))(0,0x1e01,0x1e01);
    (**(code **)(*(long *)&this->funcs + 0x130))(0xff);
    composite(this,local_88);
    lVar2 = *(long *)(lVar1 + 8) + -8;
    if (*(long *)(lVar1 + 8) == 0) {
      lVar2 = 0;
    }
    *(uint *)(lVar2 + 0x1c0) = *(uint *)(lVar2 + 0x1c0) & 0xfffe01ff | 0x200;
    lVar2 = *(long *)(lVar1 + 8) + -8;
    if (*(long *)(lVar1 + 8) == 0) {
      lVar2 = 0;
    }
    *(uint *)(lVar2 + 0x1c0) = *(uint *)(lVar2 + 0x1c0) & 0xfffffff7;
    this->maxClip = 1;
    (**(code **)(*(long *)&this->funcs + 0x130))(0);
    (**(code **)(*(long *)&this->funcs + 0x30))(1,1,1,1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGL2PaintEngineExPrivate::resetClipIfNeeded()
{
    if (maxClip != (GL_STENCIL_HIGH_BIT - 1))
        return;

    Q_Q(QOpenGL2PaintEngineEx);

    useSimpleShader();
    funcs.glEnable(GL_STENCIL_TEST);
    funcs.glColorMask(GL_FALSE, GL_FALSE, GL_FALSE, GL_FALSE);

    QRectF bounds = q->state()->matrix.inverted().mapRect(QRectF(0, 0, width, height));
    QOpenGLRect rect(bounds.left(), bounds.top(), bounds.right(), bounds.bottom());

    // Set high bit on clip region
    funcs.glStencilFunc(GL_LEQUAL, q->state()->currentClip, 0xff);
    funcs.glStencilOp(GL_KEEP, GL_INVERT, GL_INVERT);
    funcs.glStencilMask(GL_STENCIL_HIGH_BIT);
    composite(rect);

    // Reset clipping to 1 and everything else to zero
    funcs.glStencilFunc(GL_NOTEQUAL, 0x01, GL_STENCIL_HIGH_BIT);
    funcs.glStencilOp(GL_ZERO, GL_REPLACE, GL_REPLACE);
    funcs.glStencilMask(0xff);
    composite(rect);

    q->state()->currentClip = 1;
    q->state()->canRestoreClip = false;

    maxClip = 1;

    funcs.glStencilMask(0x0);
    funcs.glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
}